

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandBmsStop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    lVar2 = (long)globalUtilOptind;
    if (globalUtilOptind < argc) {
      globalUtilOptind = globalUtilOptind + 1;
      pcVar3 = argv[lVar2];
    }
    else {
      pcVar3 = (char *)0x0;
    }
    iVar1 = Abc_ExactIsRunning();
    if (iVar1 != 0) {
      Abc_ExactStop(pcVar3);
      return 0;
    }
    pcVar3 = "BMS manager is not started.";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: bms_stop [-C <num>] [-vh] [<file>]\n");
    Abc_Print(-2,"\t           stops BMS manager for recording optimum networks\n");
    Abc_Print(-2,"\t           if <file> is specified, store entries are written to that file\n");
    Abc_Print(-2,"\t-h       : print the command usage\n");
    Abc_Print(-2,"\t\n");
    Abc_Print(-2,
              "\t           This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
             );
    pcVar3 = "\t           The author can be contacted as mathias.soeken at epfl.ch\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandBmsStop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_ExactIsRunning();
    extern void Abc_ExactStop( const char *pFilename );

    int c;
    char * pFilename = NULL;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc > globalUtilOptind )
    {
        pFilename = argv[globalUtilOptind++];
    }

    if ( !Abc_ExactIsRunning() )
    {
        Abc_Print( -1, "BMS manager is not started." );
        return 1;
    }

    Abc_ExactStop( pFilename );
    return 0;

usage:
    Abc_Print( -2, "usage: bms_stop [-C <num>] [-vh] [<file>]\n" );
    Abc_Print( -2, "\t           stops BMS manager for recording optimum networks\n" );
    Abc_Print( -2, "\t           if <file> is specified, store entries are written to that file\n" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t           This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t           The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}